

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

void __thiscall QTableView::rowMoved(QTableView *this,int row,int oldIndex,int newIndex)

{
  long lVar1;
  QWidgetData *pQVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 in_register_00000034;
  int iVar8;
  
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x268))(this,CONCAT44(in_register_00000034,row));
  iVar3 = QHeaderView::logicalIndex(*(QHeaderView **)(lVar1 + 0x588),oldIndex);
  iVar4 = QHeaderView::logicalIndex(*(QHeaderView **)(lVar1 + 0x588),newIndex);
  if (*(long *)(lVar1 + 0x650) != lVar1 + 0x650) {
    QWidget::update(*(QWidget **)(lVar1 + 0x2b0));
    return;
  }
  iVar5 = rowViewportPosition(this,iVar3);
  iVar6 = rowViewportPosition(this,iVar4);
  iVar7 = rowHeight(this,iVar3);
  iVar4 = rowHeight(this,iVar4);
  iVar3 = iVar6;
  if (iVar5 < iVar6) {
    iVar3 = iVar5;
  }
  iVar8 = iVar4 + iVar6;
  if (iVar4 + iVar6 < iVar7 + iVar5) {
    iVar8 = iVar7 + iVar5;
  }
  pQVar2 = (*(QWidget **)(lVar1 + 0x2b0))->data;
  QWidget::update(*(QWidget **)(lVar1 + 0x2b0),0,iVar3,
                  ((pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i) + 1,iVar8 - iVar3);
  return;
}

Assistant:

void QTableView::rowMoved(int row, int oldIndex, int newIndex)
{
    Q_UNUSED(row);
    Q_D(QTableView);

    updateGeometries();
    int logicalOldIndex = d->verticalHeader->logicalIndex(oldIndex);
    int logicalNewIndex = d->verticalHeader->logicalIndex(newIndex);
    if (d->hasSpans()) {
        d->viewport->update();
    } else {
        int oldTop = rowViewportPosition(logicalOldIndex);
        int newTop = rowViewportPosition(logicalNewIndex);
        int oldBottom = oldTop + rowHeight(logicalOldIndex);
        int newBottom = newTop + rowHeight(logicalNewIndex);
        int top = qMin(oldTop, newTop);
        int bottom = qMax(oldBottom, newBottom);
        int height = bottom - top;
        d->viewport->update(0, top, d->viewport->width(), height);
    }
}